

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::DumpVarsTask::checkArguments
          (DumpVarsTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,0,0x7fffffff);
  if (bVar2) {
    if ((args->_M_extent)._M_extent_value != 0) {
      bVar2 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
      if (!bVar2) {
        pTVar3 = SystemSubroutine::badArg((SystemSubroutine *)this,context,*args->_M_ptr);
        return pTVar3;
      }
    }
    pTVar3 = pCVar1->voidType;
  }
  else {
    pTVar3 = pCVar1->errorType;
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        if (args.size() > 0) {
            if (!args[0]->type->isIntegral())
                return badArg(context, *args[0]);
        }

        return comp.getVoidType();
    }